

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::anon_unknown_2::addExports
          (Result<wasm::Ok> *__return_storage_ptr__,anon_unknown_2 *this,Lexer *in,Module *wasm,
          Named *item,vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ExternalKind kind)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  char *pcVar3;
  pointer puVar4;
  Export *pEVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  string local_88;
  Module *local_68;
  Lexer *local_60;
  Err local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_68 = wasm;
  local_60 = (Lexer *)this;
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__return_storage_ptr__;
  if (item != (Named *)exports) {
    do {
      sVar2 = (item->name).super_IString.str._M_len;
      pcVar3 = (item->name).super_IString.str._M_str;
      pEVar5 = Module::getExportOrNull((Module *)in,(Name)(item->name).super_IString.str);
      if (pEVar5 != (Export *)0x0) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"repeated export name","");
        Lexer::err(&local_58,local_60,&local_88);
        local_38->_M_allocated_capacity = (size_type)(local_38->_M_local_buf + 0x10);
        paVar1 = &local_58.msg.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.msg._M_dataplus._M_p == paVar1) {
          *(long *)(local_38->_M_local_buf + 0x10) =
               CONCAT71(local_58.msg.field_2._M_allocated_capacity._1_7_,
                        local_58.msg.field_2._M_local_buf[0]);
          *(undefined8 *)(local_38->_M_local_buf + 0x18) = local_58.msg.field_2._8_8_;
        }
        else {
          local_38->_M_allocated_capacity = (size_type)local_58.msg._M_dataplus._M_p;
          *(long *)(local_38->_M_local_buf + 0x10) =
               CONCAT71(local_58.msg.field_2._M_allocated_capacity._1_7_,
                        local_58.msg.field_2._M_local_buf[0]);
        }
        *(size_type *)((long)local_38 + 8) = local_58.msg._M_string_length;
        local_58.msg._M_string_length = 0;
        local_58.msg.field_2._M_local_buf[0] = '\0';
        local_38->_M_local_buf[0x20] = '\x01';
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == &local_88.field_2) {
          return (Result<wasm::Ok> *)paVar1;
        }
        local_58.msg._M_dataplus._M_p = (pointer)paVar1;
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        return (Result<wasm::Ok> *)extraout_RAX;
      }
      local_58.msg._M_dataplus._M_p = (pointer)operator_new(0x30);
      puVar4 = (local_68->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)((long)local_58.msg._M_dataplus._M_p + 0x18) =
           (local_68->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)((long)local_58.msg._M_dataplus._M_p + 0x20) = puVar4;
      *(size_t *)local_58.msg._M_dataplus._M_p = sVar2;
      *(char **)((long)local_58.msg._M_dataplus._M_p + 8) = pcVar3;
      *(ExternalKind *)((long)local_58.msg._M_dataplus._M_p + 0x10) = kind;
      *(undefined1 *)((long)local_58.msg._M_dataplus._M_p + 0x28) = 0;
      Module::addExport((Module *)in,
                        (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)&local_58);
      if ((size_t *)local_58.msg._M_dataplus._M_p != (size_t *)0x0) {
        operator_delete(local_58.msg._M_dataplus._M_p,0x30);
      }
      item = (Named *)&item->hasExplicitName;
    } while (item != (Named *)exports);
  }
  local_38->_M_local_buf[0x20] = '\0';
  return (Result<wasm::Ok> *)local_38;
}

Assistant:

Result<> addExports(Lexer& in,
                    Module& wasm,
                    const Named* item,
                    const std::vector<Name>& exports,
                    ExternalKind kind) {
  for (auto name : exports) {
    if (wasm.getExportOrNull(name)) {
      // TODO: Fix error location
      return in.err("repeated export name");
    }
    wasm.addExport(Builder(wasm).makeExport(name, item->name, kind));
  }
  return Ok{};
}